

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_unique_id(REF_GEOM ref_geom,REF_INT node,REF_INT type,REF_INT *id)

{
  REF_ADJ pRVar1;
  REF_INT *pRVar2;
  REF_ADJ_ITEM pRVar3;
  REF_ADJ_ITEM pRVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  
  iVar6 = 5;
  if (((-1 < node) && (pRVar1 = ref_geom->ref_adj, node < pRVar1->nnode)) &&
     (lVar7 = (long)pRVar1->first[(uint)node], lVar7 != -1)) {
    pRVar4 = pRVar1->item + lVar7;
    pRVar2 = ref_geom->descr;
    pRVar3 = ref_geom->ref_adj->item;
    bVar5 = false;
    while( true ) {
      if (pRVar2[(long)pRVar4->ref * 6] == type) {
        if (bVar5) {
          return 3;
        }
        *id = pRVar2[(int)(pRVar4->ref * 6 | 1)];
        bVar5 = true;
      }
      lVar7 = (long)pRVar3[(int)lVar7].next;
      if (lVar7 == -1) break;
      pRVar4 = pRVar3 + lVar7;
    }
    iVar6 = (uint)!bVar5 * 5;
  }
  return iVar6;
}

Assistant:

REF_FCN REF_STATUS ref_geom_unique_id(REF_GEOM ref_geom, REF_INT node,
                                      REF_INT type, REF_INT *id) {
  REF_INT item, geom;
  REF_BOOL found_one;
  found_one = REF_FALSE;
  each_ref_adj_node_item_with_ref(ref_geom_adj(ref_geom), node, item, geom) {
    if (type == ref_geom_type(ref_geom, geom)) {
      if (found_one) return REF_INVALID; /* second one makes invalid */
      found_one = REF_TRUE;
      *id = ref_geom_id(ref_geom, geom);
    }
  }
  if (found_one) return REF_SUCCESS;
  return REF_NOT_FOUND;
}